

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationTextOccurrence::IfcAnnotationTextOccurrence
          (IfcAnnotationTextOccurrence *this)

{
  IfcAnnotationTextOccurrence *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcAnnotationOccurrence).field_0x90,
             "IfcAnnotationTextOccurrence");
  IfcAnnotationOccurrence::IfcAnnotationOccurrence
            (&this->super_IfcAnnotationOccurrence,&PTR_construction_vtable_24__0110cb58);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationTextOccurrence,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationTextOccurrence,_0UL> *)
             &(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80,
             &PTR_construction_vtable_24__0110cbd0);
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem = 0x110caa0;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).field_0x90 = 0x110cb40;
  (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x110cac8;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x70 = 0x110caf0;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80 = 0x110cb18;
  return;
}

Assistant:

IfcAnnotationTextOccurrence() : Object("IfcAnnotationTextOccurrence") {}